

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void __thiscall llvm::APInt::fromString(APInt *this,uint numbits,StringRef str,uint8_t radix)

{
  long lVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  void *__s;
  byte bVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  uint ShiftAmt;
  char *pcVar10;
  uint uVar11;
  
  uVar6 = str.Length;
  pcVar7 = str.Data;
  if (uVar6 == 0) {
    __assert_fail("!str.empty() && \"Invalid string length\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7ad,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((0x24 < radix) || ((0x1000010504U >> ((ulong)radix & 0x3f) & 1) == 0)) {
    __assert_fail("(radix == 10 || radix == 8 || radix == 16 || radix == 2 || radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7b0,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  cVar2 = *pcVar7;
  if ((cVar2 == '+') || (uVar8 = uVar6, pcVar10 = pcVar7, cVar2 == '-')) {
    uVar8 = uVar6 - 1;
    if (uVar8 == 0) {
      __assert_fail("slen && \"String is only a sign, needs a value.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x7b8,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
    }
    pcVar10 = pcVar7 + 1;
  }
  uVar9 = (ulong)numbits;
  if (radix == '\x02' && uVar9 < uVar8) {
    __assert_fail("(slen <= numbits || radix != 2) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7ba,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  lVar1 = uVar8 - 1;
  if ((radix == '\b') && (uVar9 < (ulong)(lVar1 * 3))) {
    __assert_fail("((slen-1)*3 <= numbits || radix != 8) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7bb,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if (radix == '\x10' && (uVar9 <= (ulong)(lVar1 * 4) && lVar1 * 4 - uVar9 != 0)) {
    __assert_fail("((slen-1)*4 <= numbits || radix != 16) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7bc,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((radix == '\n') && (uVar9 < (ulong)(lVar1 * 0x40) / 0x16)) {
    __assert_fail("(((slen-1)*64)/22 <= numbits || radix != 10) && \"Insufficient bit width\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7be,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
  }
  if ((ulong)this->BitWidth < 0x41) {
    __s = (void *)0x0;
  }
  else {
    uVar9 = (ulong)((uint)((ulong)this->BitWidth + 0x3f >> 3) & 0xfffffff8);
    __s = operator_new__(uVar9);
    memset(__s,0,uVar9);
  }
  (this->U).VAL = (uint64_t)__s;
  uVar11 = (uint)radix;
  if (radix == '\b') {
    ShiftAmt = 3;
  }
  else {
    ShiftAmt = 4;
    if (uVar11 != 0x10) {
      ShiftAmt = (uint)(radix == '\x02');
    }
  }
  if (pcVar10 != pcVar7 + uVar6) {
    do {
      iVar3 = (int)*pcVar10;
      if ((radix == '$') || (bVar5 = radix, uVar11 == 0x10)) {
        uVar4 = iVar3 - 0x30;
        if (9 < uVar4) {
          if (radix - 0xb < iVar3 - 0x41U) {
            bVar5 = 10;
            if (radix - 0xb < iVar3 - 0x61U) goto LAB_0014336f;
            uVar4 = iVar3 - 0x57;
          }
          else {
            uVar4 = iVar3 - 0x37;
          }
        }
      }
      else {
LAB_0014336f:
        uVar4 = iVar3 - 0x30;
        if (bVar5 <= uVar4) {
          uVar4 = 0xffffffff;
        }
      }
      if (uVar11 <= uVar4) {
        __assert_fail("digit < radix && \"Invalid character in digit string\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                      ,0x7cc,"void llvm::APInt::fromString(unsigned int, StringRef, uint8_t)");
      }
      if (1 < uVar8) {
        if (ShiftAmt == 0) {
          operator*=(this,(ulong)radix);
        }
        else {
          operator<<=(this,ShiftAmt);
        }
      }
      operator+=(this,(ulong)uVar4);
      pcVar10 = pcVar10 + 1;
    } while (pcVar10 != pcVar7 + uVar6);
  }
  if (cVar2 != '-') {
    return;
  }
  flipAllBits(this);
  operator++(this);
  return;
}

Assistant:

void APInt::fromString(unsigned numbits, StringRef str, uint8_t radix) {
  // Check our assumptions here
  assert(!str.empty() && "Invalid string length");
  assert((radix == 10 || radix == 8 || radix == 16 || radix == 2 ||
          radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  StringRef::iterator p = str.begin();
  size_t slen = str.size();
  bool isNeg = *p == '-';
  if (*p == '-' || *p == '+') {
    p++;
    slen--;
    assert(slen && "String is only a sign, needs a value.");
  }
  assert((slen <= numbits || radix != 2) && "Insufficient bit width");
  assert(((slen-1)*3 <= numbits || radix != 8) && "Insufficient bit width");
  assert(((slen-1)*4 <= numbits || radix != 16) && "Insufficient bit width");
  assert((((slen-1)*64)/22 <= numbits || radix != 10) &&
         "Insufficient bit width");

  // Allocate memory if needed
  if (isSingleWord())
    U.VAL = 0;
  else
    U.pVal = getClearedMemory(getNumWords());

  // Figure out if we can shift instead of multiply
  unsigned shift = (radix == 16 ? 4 : radix == 8 ? 3 : radix == 2 ? 1 : 0);

  // Enter digit traversal loop
  for (StringRef::iterator e = str.end(); p != e; ++p) {
    unsigned digit = getDigit(*p, radix);
    assert(digit < radix && "Invalid character in digit string");

    // Shift or multiply the value by the radix
    if (slen > 1) {
      if (shift)
        *this <<= shift;
      else
        *this *= radix;
    }

    // Add in the digit we just interpreted
    *this += digit;
  }
  // If its negative, put it in two's complement form
  if (isNeg)
    this->negate();
}